

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::~TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                  *this,void **vtt)

{
  int *piVar1;
  
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)*vtt;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  piVar1 = (this->fNumElConnectedBackup).fStore;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  piVar1 = (this->fNumElConnected).fStore;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  TPZFrontSym<std::complex<long_double>_>::~TPZFrontSym(&this->fFront);
  TPZFileEqnStorage<std::complex<long_double>_>::~TPZFileEqnStorage(&this->fStorage);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}